

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifstrstream.cpp
# Opt level: O1

void __thiscall OpenMD::ifstrstream::~ifstrstream(ifstrstream *this,void **vtt)

{
  undefined1 *puVar1;
  _func_int **pp_Var2;
  undefined1 *puVar3;
  
  pp_Var2 = (_func_int **)*vtt;
  (this->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream = pp_Var2;
  *(void **)((long)&(this->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream +
            (long)pp_Var2[-3]) = vtt[3];
  close(this,(int)vtt);
  std::filebuf::~filebuf
            ((filebuf *)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x78);
  *(code **)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x10 =
       std::locale::locale;
  puVar3 = *(undefined1 **)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x58;
  puVar1 = &(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x68;
  if (puVar3 != puVar1) {
    operator_delete(puVar3,*(long *)puVar1 + 1);
  }
  *(code **)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x10 =
       std::istream::_M_extract<double>;
  std::locale::~locale
            ((locale *)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x48);
  pp_Var2 = (_func_int **)vtt[1];
  (this->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream = pp_Var2;
  *(void **)((long)&(this->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream +
            (long)pp_Var2[-3]) = vtt[2];
  (this->super_basic_istream<char,_std::char_traits<char>_>)._M_gcount = 0;
  return;
}

Assistant:

ifstrstream::~ifstrstream() { close(); }